

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::date_t,int,duckdb::date_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,true,false>
               (date_t *ldata,int *rdata,date_t *result_data,idx_t count,ValidityMask *mask,bool fun
               )

{
  unsigned_long *puVar1;
  ulong uVar2;
  date_t dVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t i;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (iVar7 = 0; count != iVar7; iVar7 = iVar7 + 1) {
      dVar3 = SubtractOperator::Operation<duckdb::date_t,int,duckdb::date_t>
                        (ldata->days,rdata[iVar7]);
      result_data[iVar7].days = dVar3.days;
    }
  }
  else {
    uVar8 = 0;
    for (uVar5 = 0; uVar5 != count + 0x3f >> 6; uVar5 = uVar5 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar6 = count;
        }
LAB_014f0fad:
        for (; uVar4 = uVar8, uVar8 < uVar6; uVar8 = uVar8 + 1) {
          dVar3 = SubtractOperator::Operation<duckdb::date_t,int,duckdb::date_t>
                            (ldata->days,rdata[uVar8]);
          result_data[uVar8].days = dVar3.days;
        }
      }
      else {
        uVar2 = puVar1[uVar5];
        uVar6 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar6 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_014f0fad;
        uVar4 = uVar6;
        if (uVar2 != 0) {
          for (uVar9 = 0; uVar4 = uVar9 + uVar8, uVar9 + uVar8 < uVar6; uVar9 = uVar9 + 1) {
            if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
              dVar3 = SubtractOperator::Operation<duckdb::date_t,int,duckdb::date_t>
                                (ldata->days,rdata[uVar8 + uVar9]);
              result_data[uVar8 + uVar9].days = dVar3.days;
            }
          }
        }
      }
      uVar8 = uVar4;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}